

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

JavascriptString *
Js::JavascriptString::RepeatCore
          (JavascriptString *currentString,charcount_t count,ScriptContext *scriptContext)

{
  char16 cVar1;
  uint uVar2;
  code *pcVar3;
  undefined8 src;
  bool bVar4;
  uint cchUseLength;
  BOOL BVar5;
  undefined4 *puVar6;
  Recycler *this;
  char16 *content;
  JavascriptString *pJVar7;
  ulong uVar8;
  size_t sizeInWords;
  ulong uVar9;
  char16 *dst;
  undefined1 local_80 [8];
  TrackAllocData data;
  
  if (currentString == (JavascriptString *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa34,"(currentString != nullptr)","currentString != nullptr");
    if (!bVar4) goto LAB_00d27882;
    *puVar6 = 0;
  }
  if (currentString->m_charLength == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa35,"(currentString->GetLength() > 0)",
                                "currentString->GetLength() > 0");
    if (!bVar4) goto LAB_00d27882;
    *puVar6 = 0;
  }
  if (count == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0xa36,"(count > 0)","count > 0");
    if (!bVar4) goto LAB_00d27882;
    *puVar6 = 0;
  }
  data._32_8_ = GetString(currentString);
  uVar2 = currentString->m_charLength;
  uVar8 = (ulong)uVar2;
  uVar9 = count * uVar8;
  cchUseLength = (uint)uVar9;
  if (((int)(uVar9 >> 0x20) != 0) || (0x7ffffffe < cchUseLength)) {
    JavascriptError::ThrowRangeError(scriptContext,-0x7ff5e9da,(PCWSTR)0x0);
  }
  uVar9 = uVar9 & 0xffffffff;
  sizeInWords = uVar9 + 1;
  local_80 = (undefined1  [8])&char16_t::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_80c6cf2;
  data.filename._0_4_ = 0xa43;
  data.plusSize = sizeInWords;
  this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_80);
  BVar5 = ExceptionCheck::CanHandleOutOfMemory();
  if (BVar5 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                "ExceptionCheck::CanHandleOutOfMemory()");
    if (!bVar4) goto LAB_00d27882;
    *puVar6 = 0;
  }
  content = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)32,false>
                      (this,uVar9 * 2 + 2);
  if (content == (char16 *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
    if (!bVar4) goto LAB_00d27882;
    *puVar6 = 0;
  }
  if (uVar2 == 1) {
    if (cchUseLength != 0) {
      cVar1 = *(char16 *)data._32_8_;
      uVar8 = uVar9;
      do {
        content[uVar8 - 1] = cVar1;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    dst = content + uVar9;
  }
  else {
    if (cchUseLength < uVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xa4e,"(bufferDstSize > currentLength)",
                                  "bufferDstSize > currentLength");
      if (!bVar4) goto LAB_00d27882;
      *puVar6 = 0;
    }
    src = data._32_8_;
    dst = content;
    if (count != 0) {
      do {
        js_wmemcpy_s(dst,sizeInWords,(char16 *)src,uVar8);
        sizeInWords = sizeInWords - uVar8;
        dst = dst + uVar8;
        count = count - 1;
      } while (count != 0);
    }
    if (sizeInWords != 1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                  ,0xa56,"(bufferDstSize == 1)","bufferDstSize == 1");
      if (!bVar4) {
LAB_00d27882:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
  }
  *dst = L'\0';
  pJVar7 = NewWithBufferT<Js::LiteralString,false>(content,cchUseLength,scriptContext);
  return pJVar7;
}

Assistant:

JavascriptString* JavascriptString::RepeatCore(JavascriptString* currentString, charcount_t count, ScriptContext* scriptContext)
    {
        Assert(currentString != nullptr);
        Assert(currentString->GetLength() > 0);
        Assert(count > 0);

        const char16* currentRawString = currentString->GetString();
        charcount_t currentLength = currentString->GetLength();

        charcount_t finalBufferCount = 0;
        bool hasOverflow = UInt32Math::Mul(count, currentLength, &finalBufferCount);
        if (hasOverflow || !IsValidCharCount(finalBufferCount))
        {
            JavascriptError::ThrowRangeError(scriptContext, JSERR_OutOfBoundString);
        }
        finalBufferCount = finalBufferCount + 1;

        char16* buffer = RecyclerNewArrayLeaf(scriptContext->GetRecycler(), char16, finalBufferCount);

        if (currentLength == 1)
        {
            wmemset(buffer, currentRawString[0], finalBufferCount - 1);
            buffer[finalBufferCount - 1] = '\0';
        }
        else
        {
            char16* bufferDst = buffer;
            size_t bufferDstSize = finalBufferCount;
            AnalysisAssert(bufferDstSize > currentLength);

            for (charcount_t i = 0; i < count; i += 1)
            {
                js_wmemcpy_s(bufferDst, bufferDstSize, currentRawString, currentLength);
                bufferDst += currentLength;
                bufferDstSize -= currentLength;
            }
            Assert(bufferDstSize == 1);
            *bufferDst = '\0';
        }

        return JavascriptString::NewWithBuffer(buffer, finalBufferCount - 1, scriptContext);
    }